

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall Search::predictor::set_input_at(predictor *this,size_t posn,example *ex)

{
  char *pfile;
  ostream *poVar1;
  string *pmessage;
  undefined8 uVar2;
  ulong in_RSI;
  vw_exception *in_RDI;
  stringstream __msg_1;
  stringstream __msg;
  size_t in_stack_fffffffffffffc38;
  example *in_stack_fffffffffffffc40;
  example *in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  int iVar3;
  char *in_stack_fffffffffffffc68;
  stringstream local_360 [16];
  ostream local_350;
  undefined1 local_1d1;
  stringstream local_1a0 [16];
  ostream local_190;
  ulong local_10;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  if (((in_RDI->message)._M_string_length & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(&local_190,"call to set_input_at without previous call to set_input_length");
    local_1d1 = 1;
    pfile = (char *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception(in_RDI,pfile,iVar3,in_stack_fffffffffffffc58);
    local_1d1 = 0;
    __cxa_throw(pfile,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (*(ulong *)&in_RDI->message <= in_RSI) {
    local_10 = in_RSI;
    std::__cxx11::stringstream::stringstream(local_360);
    poVar1 = std::operator<<(&local_350,"call to set_input_at with too large a position: posn (");
    pmessage = (string *)std::ostream::operator<<(poVar1,local_10);
    iVar3 = (int)((ulong)poVar1 >> 0x20);
    poVar1 = std::operator<<((ostream *)pmessage,") >= ec_cnt(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)&in_RDI->message);
    std::operator<<(poVar1,")");
    uVar2 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception(in_RDI,in_stack_fffffffffffffc68,iVar3,pmessage);
    __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  VW::copy_example_data
            (SUB81((ulong)in_stack_fffffffffffffc50 >> 0x38,0),in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (_func_void_void_ptr_void_ptr *)0x135f76);
  return;
}

Assistant:

void predictor::set_input_at(size_t posn, example& ex)
{
  if (!ec_alloced)
    THROW("call to set_input_at without previous call to set_input_length");

  if (posn >= ec_cnt)
    THROW("call to set_input_at with too large a position: posn (" << posn << ") >= ec_cnt(" << ec_cnt << ")");

  VW::copy_example_data(
      false, ec + posn, &ex, CS::cs_label.label_size, CS::cs_label.copy_label);  // TODO: the false is "audit"
}